

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeFlattenLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  ShapeConstraint *pSVar1;
  string *psVar2;
  mapped_type *pmVar3;
  ShapeRange *pSVar4;
  ShapeRange *other;
  ShapeRange local_68;
  ShapeRange local_48;
  mapped_type *local_28;
  ShapeConstraint *outputShape;
  ShapeConstraint *inputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  inputShape = (ShapeConstraint *)specLayer;
  specLayer_local = (NeuralNetworkLayer *)this;
  psVar2 = Specification::NeuralNetworkLayer::input_abi_cxx11_(specLayer,0);
  outputShape = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
                ::operator[](&this->blobShapes,psVar2);
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  pmVar3 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
           ::operator[](&this->blobShapes,psVar2);
  local_28 = pmVar3;
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_((NeuralNetworkLayer *)inputShape,0);
  ShapeConstraint::setName(pmVar3,psVar2);
  pmVar3 = local_28;
  pSVar4 = ShapeConstraint::sequenceRange(outputShape);
  ShapeConstraint::updateSequenceRange(pmVar3,pSVar4);
  pmVar3 = local_28;
  pSVar4 = ShapeConstraint::batchRange(outputShape);
  ShapeConstraint::updateBatchRange(pmVar3,pSVar4);
  pSVar1 = outputShape;
  pSVar4 = ShapeConstraint::sequenceRange(local_28);
  ShapeConstraint::updateSequenceRange(pSVar1,pSVar4);
  pSVar1 = outputShape;
  pSVar4 = ShapeConstraint::batchRange(local_28);
  ShapeConstraint::updateBatchRange(pSVar1,pSVar4);
  pmVar3 = local_28;
  pSVar4 = ShapeConstraint::channelRange(outputShape);
  other = ShapeConstraint::heightRange(outputShape);
  ShapeRange::operator*(&local_68,pSVar4,other);
  pSVar4 = ShapeConstraint::widthRange(outputShape);
  ShapeRange::operator*(&local_48,&local_68,pSVar4);
  ShapeConstraint::updateChannelRange(pmVar3,&local_48);
  ShapeConstraint::setHeight(local_28,1);
  ShapeConstraint::setWidth(local_28,1);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeFlattenLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& inputShape = blobShapes[specLayer.input(0)];
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Flatten layer " << specLayer.name() << " input shapes (before): " << std::endl;
    std::cout << inputShape;
    std::cout << "Flatten layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    outputShape.updateSequenceRange(inputShape.sequenceRange());
    outputShape.updateBatchRange(inputShape.batchRange());

    inputShape.updateSequenceRange(outputShape.sequenceRange());
    inputShape.updateBatchRange(outputShape.batchRange());

    outputShape.updateChannelRange(inputShape.channelRange() * inputShape.heightRange() * inputShape.widthRange());
    outputShape.setHeight(1);
    outputShape.setWidth(1);

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Flatten layer " << specLayer.name() << " input shapes (after): " << std::endl;
    std::cout << inputShape;
    std::cout << "Flatten layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}